

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale_common.cc
# Opt level: O0

void ScaleRowDown4Box_16_C(uint16_t *src_ptr,ptrdiff_t src_stride,uint16_t *dst,int dst_width)

{
  int x;
  intptr_t stride;
  int dst_width_local;
  uint16_t *dst_local;
  ptrdiff_t src_stride_local;
  uint16_t *src_ptr_local;
  
  dst_local = dst;
  src_ptr_local = src_ptr;
  for (x = 0; x < dst_width + -1; x = x + 2) {
    *dst_local = (uint16_t)
                 ((int)((uint)*src_ptr_local + (uint)src_ptr_local[1] + (uint)src_ptr_local[2] +
                        (uint)src_ptr_local[3] + (uint)src_ptr_local[src_stride] +
                        (uint)src_ptr_local[src_stride + 1] + (uint)src_ptr_local[src_stride + 2] +
                        (uint)src_ptr_local[src_stride + 3] + (uint)src_ptr_local[src_stride * 2] +
                        (uint)src_ptr_local[src_stride * 2 + 1] +
                        (uint)src_ptr_local[src_stride * 2 + 2] +
                        (uint)src_ptr_local[src_stride * 2 + 3] +
                        (uint)src_ptr_local[src_stride * 3] +
                        (uint)src_ptr_local[src_stride * 3 + 1] +
                        (uint)src_ptr_local[src_stride * 3 + 2] +
                        (uint)src_ptr_local[src_stride * 3 + 3] + 8) >> 4);
    dst_local[1] = (uint16_t)
                   ((int)((uint)src_ptr_local[4] + (uint)src_ptr_local[5] + (uint)src_ptr_local[6] +
                          (uint)src_ptr_local[7] + (uint)src_ptr_local[src_stride + 4] +
                          (uint)src_ptr_local[src_stride + 5] + (uint)src_ptr_local[src_stride + 6]
                          + (uint)src_ptr_local[src_stride + 7] +
                          (uint)src_ptr_local[src_stride * 2 + 4] +
                          (uint)src_ptr_local[src_stride * 2 + 5] +
                          (uint)src_ptr_local[src_stride * 2 + 6] +
                          (uint)src_ptr_local[src_stride * 2 + 7] +
                          (uint)src_ptr_local[src_stride * 3 + 4] +
                          (uint)src_ptr_local[src_stride * 3 + 5] +
                          (uint)src_ptr_local[src_stride * 3 + 6] +
                          (uint)src_ptr_local[src_stride * 3 + 7] + 8) >> 4);
    dst_local = dst_local + 2;
    src_ptr_local = src_ptr_local + 8;
  }
  if ((dst_width & 1U) != 0) {
    *dst_local = (uint16_t)
                 ((int)((uint)*src_ptr_local + (uint)src_ptr_local[1] + (uint)src_ptr_local[2] +
                        (uint)src_ptr_local[3] + (uint)src_ptr_local[src_stride] +
                        (uint)src_ptr_local[src_stride + 1] + (uint)src_ptr_local[src_stride + 2] +
                        (uint)src_ptr_local[src_stride + 3] + (uint)src_ptr_local[src_stride * 2] +
                        (uint)src_ptr_local[src_stride * 2 + 1] +
                        (uint)src_ptr_local[src_stride * 2 + 2] +
                        (uint)src_ptr_local[src_stride * 2 + 3] +
                        (uint)src_ptr_local[src_stride * 3] +
                        (uint)src_ptr_local[src_stride * 3 + 1] +
                        (uint)src_ptr_local[src_stride * 3 + 2] +
                        (uint)src_ptr_local[src_stride * 3 + 3] + 8) >> 4);
  }
  return;
}

Assistant:

void ScaleRowDown4Box_16_C(const uint16_t* src_ptr,
                           ptrdiff_t src_stride,
                           uint16_t* dst,
                           int dst_width) {
  intptr_t stride = src_stride;
  int x;
  for (x = 0; x < dst_width - 1; x += 2) {
    dst[0] = (src_ptr[0] + src_ptr[1] + src_ptr[2] + src_ptr[3] +
              src_ptr[stride + 0] + src_ptr[stride + 1] + src_ptr[stride + 2] +
              src_ptr[stride + 3] + src_ptr[stride * 2 + 0] +
              src_ptr[stride * 2 + 1] + src_ptr[stride * 2 + 2] +
              src_ptr[stride * 2 + 3] + src_ptr[stride * 3 + 0] +
              src_ptr[stride * 3 + 1] + src_ptr[stride * 3 + 2] +
              src_ptr[stride * 3 + 3] + 8) >>
             4;
    dst[1] = (src_ptr[4] + src_ptr[5] + src_ptr[6] + src_ptr[7] +
              src_ptr[stride + 4] + src_ptr[stride + 5] + src_ptr[stride + 6] +
              src_ptr[stride + 7] + src_ptr[stride * 2 + 4] +
              src_ptr[stride * 2 + 5] + src_ptr[stride * 2 + 6] +
              src_ptr[stride * 2 + 7] + src_ptr[stride * 3 + 4] +
              src_ptr[stride * 3 + 5] + src_ptr[stride * 3 + 6] +
              src_ptr[stride * 3 + 7] + 8) >>
             4;
    dst += 2;
    src_ptr += 8;
  }
  if (dst_width & 1) {
    dst[0] = (src_ptr[0] + src_ptr[1] + src_ptr[2] + src_ptr[3] +
              src_ptr[stride + 0] + src_ptr[stride + 1] + src_ptr[stride + 2] +
              src_ptr[stride + 3] + src_ptr[stride * 2 + 0] +
              src_ptr[stride * 2 + 1] + src_ptr[stride * 2 + 2] +
              src_ptr[stride * 2 + 3] + src_ptr[stride * 3 + 0] +
              src_ptr[stride * 3 + 1] + src_ptr[stride * 3 + 2] +
              src_ptr[stride * 3 + 3] + 8) >>
             4;
  }
}